

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_GetMethodProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,Var varInstance,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint uVar1;
  ScriptContext *requestContext;
  code *pcVar2;
  bool bVar3;
  PropertyId propertyId;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  RecyclableObject *obj;
  undefined4 *puVar4;
  undefined1 local_90 [8];
  PropertyValueInfo info;
  Var aValue;
  
  if (((varInstance != (Var)0x0) &&
      (bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(varInstance), bVar3)) &&
     (this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(varInstance),
     this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
  }
  propertyId = FunctionBody::GetPropertyIdFromCacheId
                         (*(FunctionBody **)(this + 0x88),playout->inlineCacheIndex);
  bVar3 = VarIs<Js::RecyclableObject>(varInstance);
  if ((bVar3) &&
     (obj = UnsafeVarTo<Js::RecyclableObject>(varInstance), obj != (RecyclableObject *)0x0)) {
    bVar3 = VarIs<Js::ScriptFunction,Js::RecyclableObject>(obj);
    if (((bVar3) &&
        (local_90 = (undefined1  [8])UnsafeVarTo<Js::ScriptFunction,Js::RecyclableObject>(obj),
        local_90 != (undefined1  [8])0x0 && (propertyId == 0x5a || propertyId == 0x4e))) &&
       (((((ScriptFunction *)local_90)->super_ScriptFunctionBase).super_JavascriptFunction.
         super_DynamicObject.super_RecyclableObject.type.ptr)->entryPoint ==
        JavascriptFunction::DeferredParsingThunk)) {
      JavascriptFunction::DeferredParse((ScriptFunction **)local_90);
    }
    uVar1 = playout->inlineCacheIndex;
    if (*(long *)(this + 0x90) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                  ,0x378,"(this->inlineCaches != nullptr)",
                                  "this->inlineCaches != nullptr");
      if (!bVar3) goto LAB_00a8076a;
      *puVar4 = 0;
    }
    if (*(uint *)(this + 200) <= uVar1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                  ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                  "cacheIndex < this->inlineCacheCount");
      if (!bVar3) goto LAB_00a8076a;
      *puVar4 = 0;
    }
    local_90 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_90,*(FunctionBody **)(this + 0x88),
               *(InlineCache **)(*(long *)(this + 0x90) + (ulong)uVar1 * 8),
               playout->inlineCacheIndex,true);
    requestContext = *(ScriptContext **)(this + 0x78);
    if (info._8_8_ == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                  ,0x21,
                                  "(IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache())"
                                  ,"IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache()"
                                 );
      if (!bVar3) goto LAB_00a8076a;
      *puVar4 = 0;
    }
    if (info.inlineCache != (InlineCache *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                  ,0x22,
                                  "(IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache())"
                                  ,
                                  "IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache()"
                                 );
      if (!bVar3) {
LAB_00a8076a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    bVar3 = InlineCache::TryGetProperty<true,true,false,false,false,false>
                      ((InlineCache *)info._8_8_,obj,obj,propertyId,(Var *)&info.inlineCacheIndex,
                       requestContext,(PropertyCacheOperationInfo *)0x0);
    if (bVar3) {
      SetReg<unsigned_int>(this,playout->Value,(Var)info._56_8_);
      return;
    }
  }
  else {
    uVar1 = playout->inlineCacheIndex;
    if (*(long *)(this + 0x90) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                  ,0x378,"(this->inlineCaches != nullptr)",
                                  "this->inlineCaches != nullptr");
      if (!bVar3) goto LAB_00a8076a;
      *puVar4 = 0;
    }
    if (*(uint *)(this + 200) <= uVar1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                  ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                  "cacheIndex < this->inlineCacheCount");
      if (!bVar3) goto LAB_00a8076a;
      *puVar4 = 0;
    }
    local_90 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_90,*(FunctionBody **)(this + 0x88),
               *(InlineCache **)(*(long *)(this + 0x90) + (ulong)uVar1 * 8),
               playout->inlineCacheIndex,true);
  }
  OP_GetMethodProperty_NoFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
            (this,varInstance,playout);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetMethodProperty(Var varInstance, unaligned T *playout)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(varInstance);
#endif
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        RecyclableObject* obj = JavascriptOperators::TryFromVar<RecyclableObject>(varInstance);
        if (obj)
        {
            ScriptFunction *fn = JavascriptOperators::TryFromVar<ScriptFunction>(obj);
            if ((propertyId == PropertyIds::apply || propertyId == PropertyIds::call) && fn)
            {
                // If the property being loaded is "apply"/"call", make an optimistic assumption that apply/call is not overridden and
                // undefer the function right here if it was defer parsed before. This is required so that the load of "apply"/"call"
                // happens from the same "type". Otherwise, we will have a polymorphic cache for load of "apply"/"call".
                if (fn->GetType()->GetEntryPoint() == JavascriptFunction::DeferredParsingThunk)
                {
                    JavascriptFunction::DeferredParse(&fn);
                }
            }
        }

        InlineCache *inlineCache = this->GetInlineCache(playout->inlineCacheIndex);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
        Var aValue;
        if (obj &&
            CacheOperators::TryGetProperty<true, true, false, false, false, false, true, false, false, false>(
                obj, false, obj, propertyId, &aValue, GetScriptContext(), nullptr, &info))
        {
            SetReg(playout->Value, aValue);
            return;
        }

        OP_GetMethodProperty_NoFastPath(varInstance, playout);
    }